

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashBinGeneric.h
# Opt level: O3

DnssecPrefixEntry * __thiscall
BinHash<DnssecPrefixEntry>::DoInsert
          (BinHash<DnssecPrefixEntry> *this,DnssecPrefixEntry *key,bool need_alloc,bool *stored)

{
  uint uVar1;
  DnssecPrefixEntry **ppDVar2;
  ulong uVar3;
  bool bVar4;
  uint uVar5;
  size_t sVar6;
  DnssecPrefixEntry *key_00;
  
  *stored = false;
  uVar1 = this->tableSize;
  if (uVar1 == 0 || key == (DnssecPrefixEntry *)0x0) {
LAB_00164950:
    key_00 = (DnssecPrefixEntry *)0x0;
  }
  else {
    uVar5 = key->hash;
    if (uVar5 == 0) {
      key->hash = 0xcacab0b0;
      if (key->prefix_len == 0) {
        uVar5 = 0xcacab0b0;
      }
      else {
        uVar5 = 0xcacab0b0;
        sVar6 = 0;
        do {
          uVar5 = (uint)key->prefix[sVar6] + uVar5 * 0x65;
          key->hash = uVar5;
          sVar6 = sVar6 + 1;
        } while (key->prefix_len != sVar6);
      }
    }
    uVar3 = (ulong)uVar5 % (ulong)uVar1;
    key_00 = (DnssecPrefixEntry *)(this->hashBin + uVar3);
    do {
      key_00 = key_00->HashNext;
      if (key_00 == (DnssecPrefixEntry *)0x0) {
        if (need_alloc) {
          key = DnssecPrefixEntry::CreateCopy(key);
        }
        if (key != (DnssecPrefixEntry *)0x0) {
          ppDVar2 = this->hashBin;
          key->HashNext = ppDVar2[uVar3];
          ppDVar2[uVar3] = key;
          *stored = true;
          this->tableCount = this->tableCount + 1;
          return key;
        }
        goto LAB_00164950;
      }
      bVar4 = DnssecPrefixEntry::IsSameKey(key,key_00);
    } while (!bVar4);
    key_00->is_dnssec = (bool)(key_00->is_dnssec | key->is_dnssec);
    *stored = false;
  }
  return key_00;
}

Assistant:

KeyObj * DoInsert(KeyObj * key, bool need_alloc, bool * stored)
    {
        KeyObj * retKey = NULL;

        *stored = false;

        if (key != NULL && tableSize > 0)
        {
            uint32_t hash_index = key->Hash() % tableSize;
            KeyObj * oldKey = hashBin[hash_index];

            while (oldKey != NULL && !key->IsSameKey(oldKey))
            {
                oldKey = oldKey->HashNext;
            }

            if (oldKey != NULL)
            {
                /* the keyed object is already in the table*/
                oldKey->Add(key);
                retKey = oldKey;
                *stored = false;
            }
            else
            {
                retKey = key;

                if (need_alloc)
                {
                    retKey = key->CreateCopy();
                }

                if (retKey != NULL)
                {
                    retKey->HashNext = hashBin[hash_index];
                    hashBin[hash_index] = retKey;
                    *stored = true;
                    tableCount++;
                }
            }
        }

        return retKey;
    }